

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O3

void tsgMakeGlobalGrid(void *grid,int dimensions,int outputs,int depth,char *sType,char *sRule,
                      int *anisotropic_weights,double alpha,double beta,char *custom_filename,
                      int *limit_levels)

{
  TypeDepth type;
  TypeOneDRule rule;
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  size_t sVar3;
  allocator<char> local_a5;
  int local_a4;
  int local_a0;
  int local_9c;
  key_type local_98;
  TasmanianSparseGrid *local_78;
  double local_70;
  double local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth>_>_>
  local_60;
  
  local_a4 = dimensions;
  local_a0 = outputs;
  local_9c = depth;
  local_78 = (TasmanianSparseGrid *)grid;
  local_70 = alpha;
  local_68 = beta;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,sType,&local_a5);
  TasGrid::IO::getStringToDepthMap_abi_cxx11_();
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth>_>_>
                 *)&local_60,&local_98);
  type = *pmVar1;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeDepth>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,sRule,&local_a5);
  TasGrid::IO::getStringRuleMap_abi_cxx11_();
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
                 *)&local_60,&local_98);
  rule = *pmVar2;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
               *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (type == type_none) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"WARNING: incorrect depth type: ",0x1f);
    if (sType == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1fb348);
    }
    else {
      sVar3 = strlen(sType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,sType,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,", defaulting to type_iptotal.",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  if (rule == rule_none) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"WARNING: incorrect rule type: ",0x1e);
    if (sType == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1fb348);
    }
    else {
      sVar3 = strlen(sType);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,sType,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,", defaulting to clenshaw-curtis.",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  TasGrid::TasmanianSparseGrid::makeGlobalGrid
            (local_78,local_a4,local_a0,local_9c,type,rule,anisotropic_weights,local_70,local_68,
             custom_filename,limit_levels);
  return;
}

Assistant:

void tsgMakeGlobalGrid(void *grid, int dimensions, int outputs, int depth, const char * sType, const char *sRule, const int *anisotropic_weights, double alpha, double beta, const char* custom_filename, const int *limit_levels){
    TypeDepth depth_type = IO::getDepthTypeString(sType);
    TypeOneDRule rule = IO::getRuleString(sRule);
    #ifndef NDEBUG
    if (depth_type == type_none){ cerr << "WARNING: incorrect depth type: " << sType << ", defaulting to type_iptotal." << endl; }
    if (rule == rule_none){ cerr << "WARNING: incorrect rule type: " << sType << ", defaulting to clenshaw-curtis." << endl; }
    #endif // NDEBUG
    ((TasmanianSparseGrid*) grid)->makeGlobalGrid(dimensions, outputs, depth, depth_type, rule, anisotropic_weights, alpha, beta, custom_filename, limit_levels);
}